

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::updateDevex(HEkkPrimal *this)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  long *in_RDI;
  double devex_1;
  double alpha_1;
  HighsInt iCol_2;
  HighsInt iRow_1;
  HighsInt iEl_1;
  double devex;
  double alpha;
  HighsInt iCol_1;
  HighsInt iEl;
  double dPivot;
  double dAlpha;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt iEntry;
  bool use_col_indices;
  HighsInt to_entry;
  double dPivotWeight;
  double in_stack_ffffffffffffff68;
  HighsSimplexAnalysis *in_stack_ffffffffffffff70;
  int local_84;
  double local_78;
  double local_70;
  double local_68;
  int local_5c;
  int local_58;
  int local_54;
  double local_50;
  double local_48;
  int local_40;
  int local_3c;
  double local_38;
  double local_30;
  int local_24;
  int local_20;
  int local_1c;
  byte local_15;
  int local_14;
  double local_10 [2];
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff70,(HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             SUB84(in_stack_ffffffffffffff68,0));
  local_10[0] = 0.0;
  local_15 = HSimplexNla::sparseLoopStyle
                       ((HSimplexNla *)(*in_RDI + 0x2b38),*(HighsInt *)((long)in_RDI + 0x35c),
                        *(HighsInt *)((long)in_RDI + 0x14),&local_14);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    if ((local_15 & 1) == 0) {
      local_84 = local_1c;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x6c),(long)local_1c);
      local_84 = *pvVar2;
    }
    local_20 = local_84;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2978),(long)local_84);
    local_24 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),(long)local_24);
    in_stack_ffffffffffffff70 = (HighsSimplexAnalysis *)(double)*pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)local_20);
    local_30 = (double)in_stack_ffffffffffffff70 * *pvVar3;
    local_10[0] = local_30 * local_30 + local_10[0];
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),
                      (long)*(int *)((long)in_RDI + 0x44));
  local_10[0] = (double)*pvVar2 + local_10[0];
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                      (long)*(int *)((long)in_RDI + 0x44));
  if (local_10[0] * 3.0 < *pvVar3) {
    *(int *)((long)in_RDI + 0xdc) = *(int *)((long)in_RDI + 0xdc) + 1;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),
                      (long)*(int *)((long)in_RDI + 0x4c));
  local_38 = *pvVar3;
  local_10[0] = local_10[0] / (local_38 * local_38);
  for (local_3c = 0; local_3c < *(int *)((long)in_RDI + 0x2ac); local_3c = local_3c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x56),(long)local_3c);
    local_40 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x59),(long)local_40);
    local_48 = *pvVar3;
    local_50 = local_10[0] * local_48 * local_48;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),(long)local_40);
    local_50 = (double)*pvVar2 + local_50;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_40);
    if (*pvVar3 < local_50) {
      in_stack_ffffffffffffff68 = local_50;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_40)
      ;
      *pvVar3 = in_stack_ffffffffffffff68;
    }
  }
  for (local_54 = 0; local_54 < *(int *)((long)in_RDI + 0x1fc); local_54 = local_54 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_54);
    local_58 = *pvVar2;
    local_5c = local_58 + (int)in_RDI[2];
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x43),(long)local_58);
    local_68 = *pvVar3;
    local_70 = local_10[0] * local_68 * local_68;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),(long)local_5c);
    local_70 = (double)*pvVar2 + local_70;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_5c);
    dVar1 = local_70;
    if (*pvVar3 < local_70) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_5c)
      ;
      *pvVar3 = dVar1;
    }
  }
  local_78 = 1.0;
  pdVar4 = std::max<double>(&local_78,local_10);
  dVar1 = *pdVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                      (long)(int)in_RDI[10]);
  *pvVar3 = dVar1;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                      (long)*(int *)((long)in_RDI + 0x44));
  *pvVar3 = 1.0;
  *(int *)(in_RDI + 0x1b) = (int)in_RDI[0x1b] + 1;
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff70,(HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             SUB84(in_stack_ffffffffffffff68,0));
  return;
}

Assistant:

void HEkkPrimal::updateDevex() {
  analysis->simplexTimerStart(DevexUpdateWeightClock);
  // Compute the pivot weight from the reference set
  double dPivotWeight = 0.0;
  HighsInt to_entry;
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_aq.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_col_indices ? col_aq.index[iEntry] : iEntry;
    HighsInt iCol = ekk_instance_.basis_.basicIndex_[iRow];
    double dAlpha = devex_index_[iCol] * col_aq.array[iRow];
    dPivotWeight += dAlpha * dAlpha;
  }
  dPivotWeight += devex_index_[variable_in] * 1.0;

  // Check if the saved weight is too large
  if (edge_weight_[variable_in] > kBadDevexWeightFactor * dPivotWeight)
    num_bad_devex_weight_++;

  // Update the devex weight for all
  double dPivot = col_aq.array[row_out];
  dPivotWeight /= (dPivot * dPivot);

  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    double alpha = row_ap.array[iCol];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    double alpha = row_ep.array[iRow];
    double devex = dPivotWeight * alpha * alpha;
    devex += devex_index_[iCol] * 1.0;
    if (edge_weight_[iCol] < devex) {
      edge_weight_[iCol] = devex;
    }
  }
  // Update devex weight for the pivots
  edge_weight_[variable_out] = max(1.0, dPivotWeight);
  edge_weight_[variable_in] = 1.0;
  num_devex_iterations_++;
  analysis->simplexTimerStop(DevexUpdateWeightClock);
}